

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_avx2.c
# Opt level: O0

void av1_cnn_convolve_no_maxpool_padding_valid_avx2
               (float **input,int in_width,int in_height,int in_stride,
               CNN_LAYER_CONFIG *layer_config,float **output,int out_stride,int start_idx,int cstep,
               int channel_step)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  float **in_RDI;
  CNN_LAYER_CONFIG *in_R8;
  CNN_LAYER_CONFIG *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  float **in_stack_00000418;
  CNN_LAYER_CONFIG *in_stack_00000420;
  int in_stack_0000042c;
  int in_stack_00000430;
  int in_stack_00000434;
  float **in_stack_00000438;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffe0;
  
  if ((((in_R8->filter_width == 5) && (in_R8->filter_height == 5)) && (in_R8->skip_width == 4)) &&
     (in_R8->skip_height == 4)) {
    cnn_convolve_no_maxpool_padding_valid_5x5_avx2
              (in_stack_00000438,in_stack_00000434,in_stack_00000430,in_stack_0000042c,
               in_stack_00000420,in_stack_00000418,in_stack_00000010,in_stack_00000018,
               in_stack_00000020,in_stack_ffffffffffffffc8);
  }
  else if (((in_R8->filter_width == 2) && (in_R8->filter_height == 2)) &&
          ((in_R8->skip_width == 2 && (in_R8->skip_height == 2)))) {
    cnn_convolve_no_maxpool_padding_valid_2x2_avx2
              ((float **)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0,
               (int)((ulong)in_R8 >> 0x20),in_R9,
               (float **)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),unaff_retaddr
               ,in_stack_00000008,in_stack_00000010,in_stack_00000018);
  }
  else {
    av1_cnn_convolve_no_maxpool_padding_valid_c
              (in_RDI,in_ESI,in_EDX,in_ECX,in_R8,(float **)in_R9,in_stack_00000008,in_stack_00000010
               ,in_stack_00000018,in_stack_00000020);
  }
  return;
}

Assistant:

void av1_cnn_convolve_no_maxpool_padding_valid_avx2(
    const float **input, int in_width, int in_height, int in_stride,
    const CNN_LAYER_CONFIG *layer_config, float **output, int out_stride,
    int start_idx, int cstep, int channel_step) {
  if (layer_config->filter_width == 5 && layer_config->filter_height == 5 &&
      layer_config->skip_width == 4 && layer_config->skip_height == 4) {
    cnn_convolve_no_maxpool_padding_valid_5x5_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else if (layer_config->filter_width == 2 &&
             layer_config->filter_height == 2 &&
             layer_config->skip_width == 2 && layer_config->skip_height == 2) {
    cnn_convolve_no_maxpool_padding_valid_2x2_avx2(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  } else {
    av1_cnn_convolve_no_maxpool_padding_valid_c(
        input, in_width, in_height, in_stride, layer_config, output, out_stride,
        start_idx, cstep, channel_step);
  }
}